

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_loading_thread.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  double dVar9;
  undefined8 uVar10;
  int bw;
  float t;
  ALLEGRO_COLOR color;
  int i;
  float y;
  float x;
  ALLEGRO_EVENT event;
  ALLEGRO_THREAD *thread;
  int loaded_bitmap;
  int current_bitmap;
  ALLEGRO_BITMAP *spin2;
  ALLEGRO_BITMAP *spin;
  ALLEGRO_FONT *font;
  _Bool redraw;
  ALLEGRO_EVENT_QUEUE *queue;
  ALLEGRO_TIMER *timer;
  ALLEGRO_DISPLAY *display;
  ALLEGRO_BITMAP *in_stack_ffffffffffffff10;
  int local_ac;
  int local_a0 [8];
  int local_80;
  undefined8 local_58;
  int local_50;
  int local_4c;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  byte bVar11;
  
  bVar11 = 1;
  local_4c = 0;
  local_50 = 0;
  uVar2 = al_install_system(0x5020700,atexit);
  if ((uVar2 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  al_init_image_addon();
  al_init_font_addon();
  al_init_primitives_addon();
  init_platform_specific();
  open_log();
  al_install_mouse();
  al_install_keyboard();
  local_40 = al_load_bitmap("data/cursor.tga");
  log_printf("default bitmap without display: %p\n",local_40);
  al_set_new_bitmap_flags(0x400);
  local_48 = al_load_bitmap("data/cursor.tga");
  log_printf("video bitmap without display: %p\n",local_48);
  log_printf("%p before create_display: ",local_40);
  print_bitmap_flags(in_stack_ffffffffffffff10);
  log_printf("\n");
  lVar3 = al_create_display(0x40);
  if (lVar3 == 0) {
    abort_example("Error creating display\n");
  }
  local_48 = al_load_bitmap("data/cursor.tga");
  log_printf("video bitmap with display: %p\n",local_48);
  log_printf("%p after create_display: ",local_40);
  print_bitmap_flags(in_stack_ffffffffffffff10);
  log_printf("\n");
  log_printf("%p after create_display: ",local_48);
  print_bitmap_flags(in_stack_ffffffffffffff10);
  log_printf("\n");
  al_destroy_display(lVar3);
  log_printf("%p after destroy_display: ",local_40);
  print_bitmap_flags(in_stack_ffffffffffffff10);
  log_printf("\n");
  log_printf("%p after destroy_display: ",local_48);
  print_bitmap_flags(in_stack_ffffffffffffff10);
  log_printf("\n");
  uVar4 = al_create_display(0x280,0x1e0);
  log_printf("%p after create_display: ",local_40);
  print_bitmap_flags(in_stack_ffffffffffffff10);
  log_printf("\n");
  log_printf("%p after create_display: ",local_48);
  print_bitmap_flags(in_stack_ffffffffffffff10);
  log_printf("\n");
  local_38 = al_load_font("data/fixed_font.tga",0);
  mutex = (ALLEGRO_MUTEX *)al_create_mutex();
  local_58 = al_create_thread(loading_thread,0);
  al_start_thread(local_58);
  uVar5 = al_create_timer(0x3fa1111111111111);
  uVar6 = al_create_event_queue();
  uVar8 = uVar6;
  uVar7 = al_get_keyboard_event_source();
  al_register_event_source(uVar8,uVar7);
  uVar8 = al_get_display_event_source(uVar4);
  al_register_event_source(uVar6,uVar8);
  uVar8 = al_get_timer_event_source(uVar5);
  al_register_event_source(uVar6,uVar8);
  al_start_timer(uVar5);
  while ((al_wait_for_event(uVar6,local_a0), local_a0[0] != 0x2a &&
         ((local_a0[0] != 10 || (local_80 != 0x3b))))) {
    if (local_a0[0] == 0x1e) {
      bVar11 = 1;
    }
    if (((bVar11 & 1) != 0) && (uVar2 = al_is_event_queue_empty(uVar6), (uVar2 & 1) != 0)) {
      uVar7 = 0;
      uVar8 = al_map_rgb_f(0);
      dVar9 = (double)al_get_time();
      bVar11 = 0;
      uVar10 = 0x3f19999a;
      uVar5 = al_map_rgb_f(0x3f000000,0x3f19999a,0x3f800000);
      al_clear_to_color(uVar5,uVar10);
      al_draw_textf(uVar8,uVar7,0x42700000,0x43a00000,local_38,0,"Loading %d%%",
                    (load_count * 100) / 100);
      al_lock_mutex(mutex);
      if (local_50 < load_count) {
        al_convert_bitmap(bitmaps[local_50]);
        local_50 = local_50 + 1;
      }
      al_unlock_mutex(mutex);
      if (local_4c < local_50) {
        al_draw_bitmap(0,bitmaps[local_4c],0);
        if (local_4c + 1 < local_50) {
          local_4c = local_4c + 1;
        }
        for (local_ac = 0; local_ac <= local_4c; local_ac = local_ac + 1) {
          iVar1 = al_get_bitmap_width(bitmaps[local_ac]);
          al_draw_scaled_rotated_bitmap
                    (0,0,(float)(((local_ac % 0x14) * 0x280) / 0x14),
                     (float)((local_ac / 0x14) * 0x18 + 0x168),32.0 / (float)iVar1,
                     32.0 / (float)iVar1,bitmaps[local_ac],0,(long)local_ac % 0x14 & 0xffffffff);
        }
      }
      if (local_50 < 100) {
        al_draw_scaled_rotated_bitmap
                  (0x41800000,0x41800000,0x41a00000,0x43a00000,0x3f800000,0x3f800000,
                   (float)dVar9 * 3.1415927 * 2.0,local_40,0);
      }
      al_flip_display();
    }
  }
  al_join_thread(local_58,0);
  al_destroy_mutex(mutex);
  al_destroy_font(local_38);
  al_destroy_display(uVar4);
  close_log(true);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   bool redraw = true;
   ALLEGRO_FONT *font;
   ALLEGRO_BITMAP *spin, *spin2;
   int current_bitmap = 0;
   int loaded_bitmap = 0;
   ALLEGRO_THREAD *thread;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_init_image_addon();
   al_init_font_addon();
   al_init_primitives_addon();
   init_platform_specific();

   open_log();

   al_install_mouse();
   al_install_keyboard();

   spin = al_load_bitmap("data/cursor.tga");
   log_printf("default bitmap without display: %p\n", spin);

   al_set_new_bitmap_flags(ALLEGRO_VIDEO_BITMAP);
   spin2 = al_load_bitmap("data/cursor.tga");
   log_printf("video bitmap without display: %p\n", spin2);
   
   log_printf("%p before create_display: ", spin);
   print_bitmap_flags(spin);
   log_printf("\n");

   display = al_create_display(64, 64);
   if (!display) {
      abort_example("Error creating display\n");
   }
   
   spin2 = al_load_bitmap("data/cursor.tga");
   log_printf("video bitmap with display: %p\n", spin2);
   
   log_printf("%p after create_display: ", spin);
   print_bitmap_flags(spin);
   log_printf("\n");
   
   log_printf("%p after create_display: ", spin2);
   print_bitmap_flags(spin2);
   log_printf("\n");

   al_destroy_display(display);
   
   log_printf("%p after destroy_display: ", spin);
   print_bitmap_flags(spin);
   log_printf("\n");
   
   log_printf("%p after destroy_display: ", spin2);
   print_bitmap_flags(spin2);
   log_printf("\n");

   display = al_create_display(640, 480);
   
   log_printf("%p after create_display: ", spin);
   print_bitmap_flags(spin);
   log_printf("\n");
   
   log_printf("%p after create_display: ", spin2);
   print_bitmap_flags(spin2);
   log_printf("\n");

   font = al_load_font("data/fixed_font.tga", 0, 0);

   mutex = al_create_mutex();
   thread = al_create_thread(loading_thread, NULL);
   al_start_thread(thread);

   timer = al_create_timer(1.0 / 30);
   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_timer_event_source(timer));
   al_start_timer(timer);

   while (1) {
      ALLEGRO_EVENT event;
      al_wait_for_event(queue, &event);

      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE)
         break;
      if (event.type == ALLEGRO_EVENT_KEY_DOWN) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
             break;
         }
      if (event.type == ALLEGRO_EVENT_TIMER)
         redraw = true;

      if (redraw && al_is_event_queue_empty(queue)) {
         float x = 20, y = 320;
         int i;
         ALLEGRO_COLOR color = al_map_rgb_f(0, 0, 0);
         float t = al_current_time();

         redraw = false;
         al_clear_to_color(al_map_rgb_f(0.5, 0.6, 1));
         
         al_draw_textf(font, color, x + 40, y, 0, "Loading %d%%",
            100 * load_count / load_total);

         al_lock_mutex(mutex);
         if (loaded_bitmap < load_count) {
            /* This will convert any video bitmaps without a display
             * (all the bitmaps being loaded in the loading_thread) to
             * video bitmaps we can use in the main thread.
             */
            al_convert_bitmap(bitmaps[loaded_bitmap]);
            loaded_bitmap++;
         }
         al_unlock_mutex(mutex);

         if (current_bitmap < loaded_bitmap) {
            int bw;
            al_draw_bitmap(bitmaps[current_bitmap], 0, 0, 0);
            if (current_bitmap + 1 < loaded_bitmap)
               current_bitmap++;

            for (i = 0; i <= current_bitmap; i++) {
               bw = al_get_bitmap_width(bitmaps[i]);
               al_draw_scaled_rotated_bitmap(bitmaps[i],
                  0, 0, (i % 20) * 640 / 20, 360 + (i / 20) * 24,
                  32.0 / bw, 32.0 / bw, 0, 0);
            }
         }
         
         if (loaded_bitmap < load_total) {
            al_draw_scaled_rotated_bitmap(spin,
               16, 16, x, y, 1.0, 1.0, t * ALLEGRO_PI * 2, 0);
         }
         
         al_flip_display();
      }
   }

   al_join_thread(thread, NULL);
   al_destroy_mutex(mutex);
   al_destroy_font(font); 
   al_destroy_display(display);

   close_log(true);

   return 0;
}